

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_check_visible(REF_CAVITY ref_cavity)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  REF_STATUS RVar7;
  long lVar8;
  long lVar9;
  REF_BOOL visible;
  undefined8 uStack_38;
  
  pRVar3 = ref_cavity->ref_grid->node;
  iVar1 = ref_cavity->node;
  if (pRVar3->ref_mpi->id == pRVar3->part[iVar1]) {
    RVar7 = 0;
    if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
      iVar5 = ref_cavity->maxface;
      if (0 < iVar5) {
        lVar8 = 8;
        lVar9 = 0;
        uStack_38 = in_RAX;
        do {
          pRVar4 = ref_cavity->f2n;
          iVar2 = *(int *)((long)pRVar4 + lVar8 + -8);
          if (((iVar1 != iVar2 && iVar2 != -1) && (iVar1 != *(int *)((long)pRVar4 + lVar8 + -4))) &&
             (iVar1 != *(int *)((long)pRVar4 + lVar8))) {
            uVar6 = ref_cavity_visible(ref_cavity,(REF_INT)lVar9,(REF_BOOL *)((long)&uStack_38 + 4))
            ;
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x7be,"ref_cavity_check_visible",(ulong)uVar6,"free");
              return uVar6;
            }
            if (uStack_38._4_4_ == 0) {
              ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
              return 0;
            }
            iVar5 = ref_cavity->maxface;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0xc;
        } while (lVar9 < iVar5);
      }
      ref_cavity->state = REF_CAVITY_VISIBLE;
      RVar7 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x7b3,
           "ref_cavity_check_visible","cavity part must own node");
    RVar7 = 1;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_check_visible(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT face;
  REF_BOOL visible;

  RAS(ref_node_owned(ref_node, node), "cavity part must own node");

  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    RSS(ref_cavity_visible(ref_cavity, face, &visible), "free");
    if (!visible) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  ref_cavity_state(ref_cavity) = REF_CAVITY_VISIBLE;

  return REF_SUCCESS;
}